

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ptrdiff_t _Num;
  ptrdiff_t _Num_2;
  ulong uVar8;
  char *buf_ptr;
  scoped_padder p;
  format_int fStack_78;
  scoped_padder local_58;
  
  scoped_padder::scoped_padder(&local_58,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pcVar6 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar5 = strlen(pcVar6);
  if (pcVar6 != (char *)0x0) {
    uVar8 = (dest->super_buffer<char>).size_ + sVar5;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8);
    }
    if (sVar5 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,sVar5);
    }
    (dest->super_buffer<char>).size_ = uVar8;
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  pcVar6 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar5 = strlen(pcVar6);
  if (pcVar6 != (char *)0x0) {
    uVar8 = (dest->super_buffer<char>).size_ + sVar5;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8);
    }
    if (sVar5 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,sVar5);
    }
    (dest->super_buffer<char>).size_ = uVar8;
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  pcVar6 = fmt::v6::format_int::format_decimal(&fStack_78,(ulong)uVar4);
  fStack_78.str_ = pcVar6;
  if ((int)uVar1 < 0) {
    fStack_78.str_ = pcVar6 + -1;
    pcVar6[-1] = '-';
  }
  pcVar7 = fStack_78.str_;
  pcVar6 = fStack_78.buffer_ + 0x15;
  sVar5 = (long)pcVar6 - (long)fStack_78.str_;
  uVar8 = (dest->super_buffer<char>).size_ + sVar5;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8);
  }
  if (pcVar6 != pcVar7) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar5);
  }
  (dest->super_buffer<char>).size_ = uVar8;
  if ((dest->super_buffer<char>).capacity_ < uVar8 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8 + 1);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  fmt_helper::pad2(tm_time->tm_hour,dest);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  fmt_helper::pad2(tm_time->tm_min,dest);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  fmt_helper::pad2(tm_time->tm_sec,dest);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  pcVar7 = fmt::v6::format_int::format_decimal(&fStack_78,(ulong)uVar4);
  fStack_78.str_ = pcVar7;
  if (iVar2 < -0x76c) {
    fStack_78.str_ = pcVar7 + -1;
    pcVar7[-1] = '-';
  }
  pcVar7 = fStack_78.str_;
  sVar5 = (long)pcVar6 - (long)fStack_78.str_;
  uVar8 = (dest->super_buffer<char>).size_ + sVar5;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8);
  }
  if (pcVar6 != pcVar7) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar5);
  }
  (dest->super_buffer<char>).size_ = uVar8;
  scoped_padder::~scoped_padder(&local_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }